

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy>::
push_back_new_elem<Impl1,Impl1>
          (vector<Interface,std::allocator<Interface>,poly::virtual_cloning_policy> *this,
          unsigned_long param_2)

{
  bool bVar1;
  my_base *this_00;
  vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
  local_60;
  Impl1 *local_40;
  Impl1 *obj_ptr;
  void_pointer nas;
  unsigned_long a;
  unsigned_long s;
  Impl1 *args_local;
  vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *this_local;
  
  a = 0x30;
  nas = (void_pointer)0x8;
  s = param_2;
  args_local = (Impl1 *)this;
  bVar1 = vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
          can_construct_new_elem
                    ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *)
                     this,0x30,8);
  if (!bVar1) {
    __assert_fail("can_construct_new_elem(s, a)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                  ,0x5a9,
                  "void poly::vector<Interface, std::allocator<Interface>, poly::virtual_cloning_policy>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::virtual_cloning_policy, T = Impl1, Args = <Impl1>]"
                 );
  }
  if (7 < *(ulong *)(this + 0x20)) {
    obj_ptr = (Impl1 *)vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
                       next_aligned_storage
                                 ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>
                                   *)this,*(size_t *)(this + 0x20));
    this_00 = vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::base
                        ((vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>
                          *)this);
    local_40 = vector_impl::allocator_base<std::allocator<unsigned_char>>::construct<Impl1*,Impl1>
                         ((allocator_base<std::allocator<unsigned_char>> *)this_00,obj_ptr,
                          (Impl1 *)s);
    vector_elem_ptr<poly::virtual_cloning_policy,std::allocator_traits<std::allocator<Interface>>>::
    vector_elem_ptr<Impl1,void>
              ((vector_elem_ptr<poly::virtual_cloning_policy,std::allocator_traits<std::allocator<Interface>>>
                *)&local_60,obj_ptr,local_40);
    vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
    ::operator=(*(vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
                  **)(this + 0x10),&local_60);
    vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>
    ::~vector_elem_ptr(&local_60);
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 0x20;
    return;
  }
  __assert_fail("_align_max >= a",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5aa,
                "void poly::vector<Interface, std::allocator<Interface>, poly::virtual_cloning_policy>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::virtual_cloning_policy, T = Impl1, Args = <Impl1>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem(type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s = sizeof(T);
    constexpr auto a = alignof(T);
    using traits     = typename allocator_traits ::template rebind_traits<T>;

    assert(can_construct_new_elem(s, a));
    assert(_align_max >= a);
    auto nas = next_aligned_storage(_align_max);
    auto obj_ptr
        = base().construct(static_cast<typename traits::pointer>(nas), std::forward<Args>(args)...);
    *_free_elem = elem_ptr(type_tag<T> {}, nas, obj_ptr);
    ++_free_elem;
}